

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDGenerator.h
# Opt level: O0

string * __thiscall
IDGenerator::genExecutionID_abi_cxx11_(string *__return_storage_ptr__,IDGenerator *this)

{
  long __val;
  IDGenerator *this_local;
  
  __val = this->m_executionID + 1;
  this->m_executionID = __val;
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string genExecutionID() { return std::to_string(++m_executionID); }